

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *filename;
  _Bool _Var1;
  clock_t cVar2;
  plutosvg_document_t *document;
  clock_t cVar3;
  plutovg_surface_t *surface;
  char *filename_00;
  char *pcVar4;
  
  if (argc - 5U < 0xfffffffe) {
    fwrite("Usage: svg2png input output [id]\n",0x21,1,_stderr);
    return -1;
  }
  filename_00 = argv[1];
  if (argc == 4) {
    pcVar4 = argv[3];
  }
  else {
    pcVar4 = (char *)0x0;
  }
  filename = argv[2];
  cVar2 = clock();
  document = plutosvg_document_load_from_file(filename_00,-1.0,-1.0);
  cVar3 = clock();
  if (document == (plutosvg_document_t *)0x0) {
    pcVar4 = "Unable to load \'%s\'\n";
LAB_00103556:
    surface = (plutovg_surface_t *)0x0;
  }
  else {
    fprintf(_stdout,"Finished loading \'%s\' in %.3f seconds\n",(double)(cVar3 - cVar2) / 1000000.0,
            filename_00);
    cVar2 = clock();
    surface = plutosvg_document_render_to_surface
                        (document,pcVar4,-1,-1,(plutovg_color_t *)0x0,(plutosvg_palette_func_t)0x0,
                         (void *)0x0);
    cVar3 = clock();
    if (surface == (plutovg_surface_t *)0x0) {
      pcVar4 = "Unable to render \'%s\'\n";
      goto LAB_00103556;
    }
    fprintf(_stdout,"Finished rendering \'%s\' in %.3f seconds\n",
            (double)(cVar3 - cVar2) / 1000000.0,filename_00);
    cVar2 = clock();
    _Var1 = plutovg_surface_write_to_png(surface,filename);
    if (_Var1) {
      cVar3 = clock();
      fprintf(_stdout,"Finished writing \'%s\' in %.3f seconds\n",
              (double)(cVar3 - cVar2) / 1000000.0,filename);
      goto LAB_001034f0;
    }
    pcVar4 = "Unable to write \'%s\'\n";
    filename_00 = filename;
  }
  fprintf(_stderr,pcVar4,filename_00);
LAB_001034f0:
  plutovg_surface_destroy(surface);
  plutosvg_document_destroy(document);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    if(argc != 3 && argc != 4) {
        fprintf(stderr, "Usage: svg2png input output [id]\n");
        return -1;
    }

    const char* input = argv[1];
    const char* output = argv[2];
    const char* id = NULL;
    if(argc == 4) {
        id = argv[3];
    }

    plutosvg_document_t* document = NULL;
    plutovg_surface_t* surface = NULL;
    clock_t start, end;

    start = clock();
    document = plutosvg_document_load_from_file(input, -1, -1);
    end = clock();

    if(document == NULL) {
        fprintf(stderr, "Unable to load '%s'\n", input);
        goto cleanup;
    }

    fprintf(stdout, "Finished loading '%s' in %.3f seconds\n", input, elapsed_time(start, end));

    start = clock();
    surface = plutosvg_document_render_to_surface(document, id, -1, -1, NULL, NULL, NULL);
    end = clock();

    if(surface == NULL) {
        fprintf(stderr, "Unable to render '%s'\n", input);
        goto cleanup;
    }

    fprintf(stdout, "Finished rendering '%s' in %.3f seconds\n", input, elapsed_time(start, end));

    start = clock();
    if(!plutovg_surface_write_to_png(surface, output)) {
        fprintf(stderr, "Unable to write '%s'\n", output);
        goto cleanup;
    }
    end = clock();

    fprintf(stdout, "Finished writing '%s' in %.3f seconds\n", output, elapsed_time(start, end));
cleanup:
    plutovg_surface_destroy(surface);
    plutosvg_document_destroy(document);
    return 0;
}